

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packetgen.cpp
# Opt level: O1

int main(void)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  undefined6 uVar4;
  undefined2 uVar5;
  undefined6 uVar6;
  long *plVar7;
  char cVar8;
  ulong *puVar9;
  istream *piVar10;
  ostream *poVar11;
  ulong uVar12;
  _Alloc_hider _Var13;
  Simple dto;
  string str;
  int is_simple;
  string cmd;
  uint64_t seq;
  string serial;
  string payload;
  uint64_t param;
  undefined1 local_148 [24];
  ushort uStack_130;
  undefined6 uStack_12e;
  _Alloc_hider local_128;
  undefined1 local_120 [24];
  long *local_108;
  undefined8 local_100;
  long local_f8;
  undefined8 uStack_f0;
  int local_e4;
  undefined1 *local_e0;
  long local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  undefined8 local_c0;
  char *local_b8;
  long local_b0;
  char local_a8;
  undefined7 uStack_a7;
  long *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  undefined8 uStack_80;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  long *local_58;
  long local_50;
  long local_48 [3];
  
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  local_e0 = &local_d0;
  local_d8 = 0;
  local_d0 = 0;
  cVar8 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x48);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_e0,cVar8);
  cVar8 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x48);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_78,cVar8);
  puVar9 = (ulong *)std::istream::operator>>((istream *)&std::cin,&local_e4);
  piVar10 = std::istream::_M_extract<unsigned_long>(puVar9);
  std::istream::_M_extract<unsigned_long>((ulong *)piVar10);
  local_b8 = &local_a8;
  local_b0 = 0;
  local_a8 = '\0';
  local_148._16_2_ = (undefined2)((ulong)local_c0 >> 0x30);
  uVar5 = local_148._16_2_;
  local_148._10_6_ = (undefined6)local_c0;
  uVar4 = local_148._10_6_;
  if (local_e4 == 0) {
    local_98 = (long *)&local_88;
    std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_e0,local_e0 + local_d8);
    if (local_98 == (long *)&local_88) {
      uStack_f0 = uStack_80;
      local_108 = &local_f8;
    }
    else {
      local_108 = local_98;
    }
    local_f8 = CONCAT71(uStack_87,local_88);
    local_100 = local_90;
    local_90 = 0;
    local_88 = 0;
    local_128._M_p = local_120 + 8;
    local_148._10_6_ = 0;
    local_148._16_2_ = 0;
    local_148._18_6_ = 0;
    uStack_130 = 0;
    local_120._0_8_ = 0;
    local_120[8] = '\0';
    local_148._0_8_ = 0;
    local_148[8] = '\0';
    local_148[9] = '\0';
    local_98 = (long *)&local_88;
    std::__cxx11::string::operator=((string *)&local_128,(string *)&local_78);
    plVar7 = local_108;
    strcpy(local_148,(char *)local_108);
    local_148._10_6_ = uVar4;
    local_148._16_2_ = uVar5;
    if (plVar7 != &local_f8) {
      operator_delete(plVar7,local_f8 + 1);
    }
    local_148._18_6_ = (undefined6)local_48[2];
    uStack_130 = (ushort)((ulong)local_48[2] >> 0x30);
    if (local_98 != (long *)&local_88) {
      operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[PACKETGEN] ",0xc);
    poVar11 = operator<<((ostream *)&std::cerr,(Complex *)local_148);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    uVar6 = local_148._18_6_;
    uVar4 = local_148._10_6_;
    lVar1 = CONCAT26(local_148._16_2_,local_148._10_6_);
    lVar2 = CONCAT26(uStack_130,local_148._18_6_);
    local_148._10_6_ =
         (uint6)((ushort)local_148._16_2_ >> 8) |
         (uint6)((((ulong)(ushort)local_148._16_2_ & 0xff) << 0x30) >> 0x28) |
         ((uint6)local_148._10_6_ >> 0x10 & 0xff000000) >> 8 |
         (uint6)local_148._10_6_ >> 8 & 0xff000000 |
         (uint6)(((ulong)(uint6)local_148._10_6_ & 0xff000000) << 8) |
         (uint6)(((ulong)(uint6)local_148._10_6_ & 0xff0000) << 0x18);
    local_148._16_2_ = SUB62(uVar4,1) & 0xff | (ushort)((ulong)(lVar1 << 0x38) >> 0x30);
    local_148._18_6_ =
         (uint6)(uStack_130 >> 8) | (uint6)((((ulong)uStack_130 & 0xff) << 0x30) >> 0x28) |
         ((uint6)local_148._18_6_ >> 0x10 & 0xff000000) >> 8 |
         (uint6)local_148._18_6_ >> 8 & 0xff000000 |
         (uint6)(((ulong)(uint6)local_148._18_6_ & 0xff000000) << 8) |
         (uint6)(((ulong)(uint6)local_148._18_6_ & 0xff0000) << 0x18);
    uStack_130 = SUB62(uVar6,1) & 0xff | (ushort)((ulong)(lVar2 << 0x38) >> 0x30);
    local_108 = &local_f8;
    std::__cxx11::string::_M_construct((ulong)&local_108,(char)local_120._0_8_ + '\x1a');
    plVar7 = local_108;
    uVar3 = CONCAT26(uStack_130,local_148._18_6_);
    *(ulong *)((long)local_108 + 10) = CONCAT26(local_148._16_2_,local_148._10_6_);
    *(undefined8 *)((long)plVar7 + 0x12) = uVar3;
    lVar1 = CONCAT62(local_148._10_6_,local_148._8_2_);
    *plVar7 = local_148._0_8_;
    plVar7[1] = lVar1;
    memcpy((void *)((long)local_108 + 0x1a),local_128._M_p,local_120._0_8_);
    uVar6 = local_148._18_6_;
    uVar4 = local_148._10_6_;
    lVar1 = CONCAT26(local_148._16_2_,local_148._10_6_);
    lVar2 = CONCAT26(uStack_130,local_148._18_6_);
    local_148._10_6_ =
         (uint6)((ushort)local_148._16_2_ >> 8) |
         (uint6)((((ulong)(ushort)local_148._16_2_ & 0xff) << 0x30) >> 0x28) |
         ((uint6)local_148._10_6_ >> 0x10 & 0xff000000) >> 8 |
         (uint6)local_148._10_6_ >> 8 & 0xff000000 |
         (uint6)(((ulong)(uint6)local_148._10_6_ & 0xff000000) << 8) |
         (uint6)(((ulong)(uint6)local_148._10_6_ & 0xff0000) << 0x18);
    local_148._16_2_ = SUB62(uVar4,1) & 0xff | (ushort)((ulong)(lVar1 << 0x38) >> 0x30);
    local_148._18_6_ =
         (uint6)(uStack_130 >> 8) | (uint6)((((ulong)uStack_130 & 0xff) << 0x30) >> 0x28) |
         ((uint6)local_148._18_6_ >> 0x10 & 0xff000000) >> 8 |
         (uint6)local_148._18_6_ >> 8 & 0xff000000 |
         (uint6)(((ulong)(uint6)local_148._18_6_ & 0xff000000) << 8) |
         (uint6)(((ulong)(uint6)local_148._18_6_ & 0xff0000) << 0x18);
    uStack_130 = SUB62(uVar6,1) & 0xff | (ushort)((ulong)(lVar2 << 0x38) >> 0x30);
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_108);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_128._M_p == local_120 + 8) goto LAB_00102774;
    uVar12 = CONCAT71(local_120._9_7_,local_120[8]);
    _Var13._M_p = local_128._M_p;
  }
  else {
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_e0,local_e0 + local_d8);
    local_108 = &local_f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,local_58,local_50 + (long)local_58);
    local_148._10_6_ = 0;
    local_148._16_2_ = 0;
    uStack_130 = (ushort)local_120;
    uStack_12e = (undefined6)((ulong)local_120 >> 0x10);
    local_128._M_p = (pointer)0x0;
    local_120._0_8_ = local_120._0_8_ & 0xffffffffffffff00;
    local_148._0_8_ = 0;
    local_148[8] = '\0';
    local_148[9] = '\0';
    std::__cxx11::string::operator=((string *)&uStack_130,(string *)&local_78);
    plVar7 = local_108;
    strcpy(local_148,(char *)local_108);
    local_148._10_6_ = uVar4;
    local_148._16_2_ = uVar5;
    if (plVar7 != &local_f8) {
      operator_delete(plVar7,local_f8 + 1);
    }
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[PACKETGEN] ",0xc);
    poVar11 = operator<<((ostream *)&std::cerr,(Simple *)local_148);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    uVar4 = local_148._10_6_;
    lVar1 = CONCAT26(local_148._16_2_,local_148._10_6_);
    local_148._10_6_ =
         (uint6)((ushort)local_148._16_2_ >> 8) |
         (uint6)((((ulong)(ushort)local_148._16_2_ & 0xff) << 0x30) >> 0x28) |
         ((uint6)local_148._10_6_ >> 0x10 & 0xff000000) >> 8 |
         (uint6)local_148._10_6_ >> 8 & 0xff000000 |
         (uint6)(((ulong)(uint6)local_148._10_6_ & 0xff000000) << 8) |
         (uint6)(((ulong)(uint6)local_148._10_6_ & 0xff0000) << 0x18);
    local_148._16_2_ = SUB62(uVar4,1) & 0xff | (ushort)((ulong)(lVar1 << 0x38) >> 0x30);
    local_108 = &local_f8;
    std::__cxx11::string::_M_construct((ulong)&local_108,(char)local_128._M_p + '\x12');
    plVar7 = local_108;
    *(undefined2 *)(local_108 + 2) = local_148._16_2_;
    lVar1 = CONCAT62(local_148._10_6_,local_148._8_2_);
    *plVar7 = local_148._0_8_;
    plVar7[1] = lVar1;
    memcpy((void *)((long)local_108 + 0x12),(void *)CONCAT62(uStack_12e,uStack_130),
           (size_t)local_128._M_p);
    uVar4 = local_148._10_6_;
    lVar1 = CONCAT26(local_148._16_2_,local_148._10_6_);
    local_148._10_6_ =
         (uint6)((ushort)local_148._16_2_ >> 8) |
         (uint6)((((ulong)(ushort)local_148._16_2_ & 0xff) << 0x30) >> 0x28) |
         ((uint6)local_148._10_6_ >> 0x10 & 0xff000000) >> 8 |
         (uint6)local_148._10_6_ >> 8 & 0xff000000 |
         (uint6)(((ulong)(uint6)local_148._10_6_ & 0xff000000) << 8) |
         (uint6)(((ulong)(uint6)local_148._10_6_ & 0xff0000) << 0x18);
    local_148._16_2_ = SUB62(uVar4,1) & 0xff | (ushort)((ulong)(lVar1 << 0x38) >> 0x30);
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_108);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    _Var13._M_p = (pointer)CONCAT62(uStack_12e,uStack_130);
    uVar12 = local_120._0_8_;
    if (_Var13._M_p == local_120) goto LAB_00102774;
  }
  operator_delete(_Var13._M_p,uVar12 + 1);
LAB_00102774:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,local_b0);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  return 0;
}

Assistant:

int main() {
  int is_simple;
  uint64_t param, seq;
  std::string payload, cmd;
  std::getline(std::cin, cmd);
  std::getline(std::cin, payload);
  std::cin >> is_simple >> param >> seq;

  std::string serial;
  if (is_simple) {
    Simple dto = create(seq, cmd, payload);
    std::cerr << "[PACKETGEN] " << dto << std::endl;
    serial = marshall(dto);
  } else {
    Complex dto = create(seq, cmd, payload, param);
    std::cerr << "[PACKETGEN] " << dto << std::endl;
    serial = marshall(dto);
  }

  std::cout << serial;

  return 0;
}